

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSConverter.cpp
# Opt level: O3

void __thiscall Assimp::Discreet3DSImporter::ConvertMeshes(Discreet3DSImporter *this,aiScene *pcOut)

{
  vector<unsigned_int,std::allocator<unsigned_int>> *this_00;
  uint uVar1;
  pointer pMVar2;
  iterator __position;
  pointer paVar3;
  undefined1 auVar4 [16];
  byte bVar5;
  float fVar6;
  aiScene *paVar7;
  ulong uVar8;
  ulong uVar9;
  ulong *puVar10;
  aiMesh *paVar11;
  aiFace *paVar12;
  aiVector3D *paVar13;
  uint *puVar14;
  long lVar15;
  Scene *pSVar16;
  aiMesh **__s;
  runtime_error *this_01;
  int iVar17;
  aiFace *paVar18;
  pointer puVar19;
  pointer pMVar20;
  ulong uVar21;
  uint uVar22;
  char *pcVar23;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar24;
  int iVar25;
  pointer pMVar26;
  uint uVar27;
  bool bVar28;
  bool bVar29;
  uint iNum;
  aiMesh *meshOut;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> avOutMeshes;
  aiString name;
  int local_4c0;
  uint local_4bc;
  aiMesh *local_4b8;
  int local_4ac;
  long local_4a8;
  uint local_4a0;
  uint local_49c;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> local_498;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_478 [2];
  undefined1 local_468 [16];
  ulong local_458;
  aiScene *local_450;
  Discreet3DSImporter *local_448;
  ulong local_440;
  uint local_434;
  char local_430;
  char local_42f [1023];
  
  local_498.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_498.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (aiMesh **)0x0;
  local_498.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (aiMesh **)0x0;
  local_450 = pcOut;
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve
            (&local_498,
             ((long)(this->mScene->mMeshes).
                    super__Vector_base<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->mScene->mMeshes).
                    super__Vector_base<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * 0x97b425ed097b426);
  local_434 = 0;
  local_430 = '\0';
  memset(local_42f,0x1b,0x3ff);
  pSVar16 = this->mScene;
  pMVar26 = (pSVar16->mMeshes).
            super__Vector_base<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pMVar26 ==
      (pSVar16->mMeshes).super__Vector_base<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar28 = true;
  }
  else {
    local_4c0 = 0;
    local_4ac = 0;
    local_448 = this;
    do {
      pMVar20 = (pSVar16->mMaterials).
                super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pMVar2 = (pSVar16->mMaterials).
               super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      uVar21 = ((long)pMVar2 - (long)pMVar20) / 0x2b8;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar21;
      uVar8 = SUB168(auVar4 * ZEXT816(0x18),0);
      uVar9 = uVar8 + 8;
      if (0xfffffffffffffff7 < uVar8) {
        uVar9 = 0xffffffffffffffff;
      }
      if (SUB168(auVar4 * ZEXT816(0x18),8) != 0) {
        uVar9 = 0xffffffffffffffff;
      }
      puVar10 = (ulong *)operator_new__(uVar9);
      *puVar10 = uVar21;
      pvVar24 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(puVar10 + 1);
      if (pMVar2 != pMVar20) {
        memset(pvVar24,0,((uVar21 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
      }
      uVar27 = 1;
      pcVar23 = &local_430;
      iVar17 = local_4ac;
      if (local_4ac < 0) {
        local_430 = '-';
        iVar17 = -local_4ac;
        uVar27 = 2;
        pcVar23 = local_42f;
      }
      local_4ac = local_4ac + 1;
      iVar25 = 1000000000;
      bVar5 = 0;
      do {
        bVar28 = (int)((long)iVar17 / (long)iVar25) != 0;
        bVar29 = iVar25 == 1;
        if ((bool)(bVar5 | bVar29 | bVar28)) {
          *pcVar23 = (char)((long)iVar17 / (long)iVar25) + '0';
          pcVar23 = pcVar23 + 1;
          uVar27 = uVar27 + 1;
          iVar17 = iVar17 % iVar25;
          if (iVar25 == 1) break;
        }
        iVar25 = iVar25 / 10;
        bVar5 = bVar5 | bVar29 | bVar28;
      } while (uVar27 < 0x400);
      *pcVar23 = '\0';
      uVar27 = uVar27 - 1;
      local_4bc = 0;
      puVar14 = (pMVar26->mFaceMaterials).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_478[0] = pvVar24;
      local_434 = uVar27;
      if (puVar14 !=
          (pMVar26->mFaceMaterials).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        do {
          this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)(local_478[0] + *puVar14);
          __position._M_current = *(uint **)(this_00 + 8);
          if (__position._M_current == *(uint **)(this_00 + 0x10)) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>(this_00,__position,&local_4bc);
          }
          else {
            *__position._M_current = local_4bc;
            *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 4;
          }
          puVar14 = puVar14 + 1;
          local_4bc = local_4bc + 1;
        } while (puVar14 !=
                 (pMVar26->mFaceMaterials).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      pSVar16 = this->mScene;
      pMVar20 = (pSVar16->mMaterials).
                super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pvVar24 = local_478[0];
      if ((pSVar16->mMaterials).
          super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>.
          _M_impl.super__Vector_impl_data._M_finish == pMVar20) {
        if (local_478[0] != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0)
        goto LAB_0067baa1;
      }
      else {
        local_440 = (ulong)uVar27;
        uVar21 = 0;
        local_4a0 = uVar27;
        do {
          local_4a8 = uVar21 * 3;
          if (pvVar24[uVar21].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              pvVar24[uVar21].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            local_458 = uVar21;
            paVar11 = (aiMesh *)operator_new(0x520);
            paVar11->mNumVertices = 0;
            paVar11->mNumFaces = 0;
            memset(&paVar11->mVertices,0,0xcc);
            paVar11->mBones = (aiBone **)0x0;
            paVar11->mMaterialIndex = 0;
            (paVar11->mName).length = 0;
            (paVar11->mName).data[0] = '\0';
            memset((paVar11->mName).data + 1,0x1b,0x3ff);
            paVar11->mNumAnimMeshes = 0;
            paVar11->mAnimMeshes = (aiAnimMesh **)0x0;
            paVar11->mMethod = 0;
            (paVar11->mAABB).mMin.x = 0.0;
            (paVar11->mAABB).mMin.y = 0.0;
            (paVar11->mAABB).mMin.z = 0.0;
            (paVar11->mAABB).mMax.x = 0.0;
            (paVar11->mAABB).mMax.y = 0.0;
            (paVar11->mAABB).mMax.z = 0.0;
            memset(paVar11->mColors + 1,0,0x98);
            uVar21 = local_440;
            (paVar11->mName).length = uVar27;
            local_4b8 = paVar11;
            memcpy((paVar11->mName).data,&local_430,local_440);
            (paVar11->mName).data[uVar21] = '\0';
            paVar11->mPrimitiveTypes = 4;
            paVar11->mMaterialIndex = (uint)local_458;
            paVar11->mColors[0] = (aiColor4D *)pMVar26;
            if (local_498.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_498.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                        ((vector<aiMesh*,std::allocator<aiMesh*>> *)&local_498,
                         (iterator)
                         local_498.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_4b8);
            }
            else {
              *local_498.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
               super__Vector_impl_data._M_finish = paVar11;
              local_498.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_498.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            paVar11 = local_4b8;
            uVar27 = (uint)((ulong)((long)(&(local_478[0]->
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            )._M_impl.super__Vector_impl_data._M_finish)[local_4a8]
                                   - (long)(&(local_478[0]->
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             )._M_impl.super__Vector_impl_data._M_start)[local_4a8])
                           >> 2);
            local_4b8->mNumFaces = uVar27;
            local_4b8->mNumVertices = uVar27 * 3;
            uVar21 = (ulong)local_4b8->mNumFaces;
            puVar10 = (ulong *)operator_new__(uVar21 * 0x10 + 8);
            *puVar10 = uVar21;
            paVar12 = (aiFace *)(puVar10 + 1);
            if (uVar21 != 0) {
              paVar18 = paVar12;
              do {
                paVar18->mNumIndices = 0;
                paVar18->mIndices = (uint *)0x0;
                paVar18 = paVar18 + 1;
              } while (paVar18 != paVar12 + uVar21);
            }
            paVar11->mFaces = paVar12;
            local_4c0 = local_4c0 + paVar11->mNumFaces;
            uVar27 = paVar11->mNumVertices;
            uVar21 = (ulong)uVar27 * 0xc;
            paVar13 = (aiVector3D *)operator_new__(uVar21);
            if (uVar27 != 0) {
              memset(paVar13,0,((uVar21 - 0xc) / 0xc) * 0xc + 0xc);
            }
            paVar11->mVertices = paVar13;
            uVar27 = paVar11->mNumVertices;
            uVar21 = (ulong)uVar27 * 0xc;
            paVar13 = (aiVector3D *)operator_new__(uVar21);
            if (uVar27 != 0) {
              memset(paVar13,0,((uVar21 - 0xc) / 0xc) * 0xc + 0xc);
            }
            paVar11->mNormals = paVar13;
            if ((pMVar26->mTexCoords).
                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                (pMVar26->mTexCoords).
                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                super__Vector_impl_data._M_start) {
              uVar27 = paVar11->mNumVertices;
              uVar21 = (ulong)uVar27 * 0xc;
              paVar13 = (aiVector3D *)operator_new__(uVar21);
              if (uVar27 != 0) {
                memset(paVar13,0,((uVar21 - 0xc) / 0xc) * 0xc + 0xc);
              }
              paVar11->mTextureCoords[0] = paVar13;
            }
            puVar19 = (&(local_478[0]->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_start)[local_4a8];
            if ((&(local_478[0]->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_finish)[local_4a8] != puVar19) {
              uVar21 = 0;
              uVar27 = 0;
              do {
                uVar22 = uVar27;
                uVar27 = puVar19[uVar21];
                paVar12 = local_4b8->mFaces;
                puVar14 = (uint *)operator_new__(0xc);
                paVar12[uVar21].mIndices = puVar14;
                paVar12[uVar21].mNumIndices = 3;
                lVar15 = 0;
                do {
                  uVar1 = (pMVar26->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mFaces.
                          super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar27].
                          super_FaceWithSmoothingGroup.mIndices[lVar15];
                  paVar3 = (pMVar26->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mPositions.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  paVar13 = local_4b8->mVertices;
                  uVar8 = (ulong)uVar22 + lVar15 & 0xffffffff;
                  paVar13[uVar8].z = *(float *)((long)(paVar3 + uVar1) + 8);
                  paVar3 = paVar3 + uVar1;
                  fVar6 = paVar3->y;
                  paVar13 = paVar13 + uVar8;
                  paVar13->x = paVar3->x;
                  paVar13->y = fVar6;
                  paVar3 = (pMVar26->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mNormals.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  paVar13 = local_4b8->mNormals;
                  paVar13[uVar8].z = paVar3[uVar1].z;
                  paVar3 = paVar3 + uVar1;
                  fVar6 = paVar3->y;
                  paVar13 = paVar13 + uVar8;
                  paVar13->x = paVar3->x;
                  paVar13->y = fVar6;
                  paVar3 = (pMVar26->mTexCoords).
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  if ((pMVar26->mTexCoords).
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish != paVar3) {
                    paVar13 = local_4b8->mTextureCoords[0];
                    paVar13[uVar8].z = paVar3[uVar1].z;
                    fVar6 = paVar3[uVar1].y;
                    paVar13 = paVar13 + uVar8;
                    paVar13->x = paVar3[uVar1].x;
                    paVar13->y = fVar6;
                  }
                  paVar12[uVar21].mIndices[lVar15] = (uint)((ulong)uVar22 + lVar15);
                  lVar15 = lVar15 + 1;
                } while (lVar15 != 3);
                uVar21 = (ulong)((int)uVar21 + 1);
                puVar19 = (&(local_478[0]->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start)[local_4a8];
                uVar27 = uVar22 + 3;
                local_49c = uVar22;
              } while (uVar21 < (ulong)((long)(&(local_478[0]->
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                )._M_impl.super__Vector_impl_data._M_finish)
                                              [local_4a8] - (long)puVar19 >> 2));
            }
            pSVar16 = local_448->mScene;
            pMVar20 = (pSVar16->mMaterials).
                      super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pvVar24 = local_478[0];
            uVar21 = local_458;
            this = local_448;
            uVar27 = local_4a0;
          }
          uVar21 = (ulong)((int)uVar21 + 1);
          uVar8 = ((long)(pSVar16->mMaterials).
                         super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar20 >> 3) *
                  0x66fd0eb66fd0eb67;
        } while (uVar21 <= uVar8 && uVar8 - uVar21 != 0);
LAB_0067baa1:
        std::default_delete<std::vector<unsigned_int,std::allocator<unsigned_int>>[]>::operator()
                  ((default_delete<std::vector<unsigned_int,std::allocator<unsigned_int>>[]> *)
                   local_478,pvVar24);
        pSVar16 = this->mScene;
      }
      pMVar26 = pMVar26 + 1;
    } while (pMVar26 !=
             (pSVar16->mMeshes).
             super__Vector_base<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>._M_impl.
             super__Vector_impl_data._M_finish);
    bVar28 = local_4c0 == 0;
  }
  paVar7 = local_450;
  uVar21 = (long)local_498.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_498.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_start & 0x7fffffff8;
  uVar27 = (uint)((ulong)((long)local_498.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_498.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
  local_450->mNumMeshes = uVar27;
  __s = (aiMesh **)operator_new__(uVar21);
  memset(__s,0,uVar21);
  paVar7->mMeshes = __s;
  if (uVar27 != 0) {
    uVar21 = 0;
    do {
      paVar7->mMeshes[uVar21] =
           local_498.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
           super__Vector_impl_data._M_start[uVar21];
      uVar21 = uVar21 + 1;
    } while (uVar21 < paVar7->mNumMeshes);
  }
  if (bVar28) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_478[0] = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_468;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_478,"No faces loaded. The mesh is empty","");
    std::runtime_error::runtime_error(this_01,(string *)local_478);
    *(undefined ***)this_01 = &PTR__runtime_error_007fc4b8;
    __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_498.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_498.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Discreet3DSImporter::ConvertMeshes(aiScene* pcOut)
{
    std::vector<aiMesh*> avOutMeshes;
    avOutMeshes.reserve(mScene->mMeshes.size() * 2);

    unsigned int iFaceCnt = 0,num = 0;
    aiString name;

    // we need to split all meshes by their materials
    for (std::vector<D3DS::Mesh>::iterator i =  mScene->mMeshes.begin(); i != mScene->mMeshes.end();++i)    {
        std::unique_ptr< std::vector<unsigned int>[] > aiSplit(new std::vector<unsigned int>[mScene->mMaterials.size()]);

        name.length = ASSIMP_itoa10(name.data,num++);

        unsigned int iNum = 0;
        for (std::vector<unsigned int>::const_iterator a =  (*i).mFaceMaterials.begin();
            a != (*i).mFaceMaterials.end();++a,++iNum)
        {
            aiSplit[*a].push_back(iNum);
        }
        // now generate submeshes
        for (unsigned int p = 0; p < mScene->mMaterials.size();++p)
        {
            if (aiSplit[p].empty()) {
                continue;
            }
            aiMesh* meshOut = new aiMesh();
            meshOut->mName = name;
            meshOut->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

            // be sure to setup the correct material index
            meshOut->mMaterialIndex = p;

            // use the color data as temporary storage
            meshOut->mColors[0] = (aiColor4D*)(&*i);
            avOutMeshes.push_back(meshOut);

            // convert vertices
            meshOut->mNumFaces = (unsigned int)aiSplit[p].size();
            meshOut->mNumVertices = meshOut->mNumFaces*3;

            // allocate enough storage for faces
            meshOut->mFaces = new aiFace[meshOut->mNumFaces];
            iFaceCnt += meshOut->mNumFaces;

            meshOut->mVertices = new aiVector3D[meshOut->mNumVertices];
            meshOut->mNormals  = new aiVector3D[meshOut->mNumVertices];
            if ((*i).mTexCoords.size())
            {
                meshOut->mTextureCoords[0] = new aiVector3D[meshOut->mNumVertices];
            }
            for (unsigned int q = 0, base = 0; q < aiSplit[p].size();++q)
            {
                unsigned int index = aiSplit[p][q];
                aiFace& face = meshOut->mFaces[q];

                face.mIndices = new unsigned int[3];
                face.mNumIndices = 3;

                for (unsigned int a = 0; a < 3;++a,++base)
                {
                    unsigned int idx = (*i).mFaces[index].mIndices[a];
                    meshOut->mVertices[base]  = (*i).mPositions[idx];
                    meshOut->mNormals [base]  = (*i).mNormals[idx];

                    if ((*i).mTexCoords.size())
                        meshOut->mTextureCoords[0][base] = (*i).mTexCoords[idx];

                    face.mIndices[a] = base;
                }
            }
        }
    }

    // Copy them to the output array
    pcOut->mNumMeshes = (unsigned int)avOutMeshes.size();
    pcOut->mMeshes = new aiMesh*[pcOut->mNumMeshes]();
    for (unsigned int a = 0; a < pcOut->mNumMeshes;++a) {
        pcOut->mMeshes[a] = avOutMeshes[a];
    }

    // We should have at least one face here
    if (!iFaceCnt) {
        throw DeadlyImportError("No faces loaded. The mesh is empty");
    }
}